

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode Curl_sasl_continue(SASL *sasl,connectdata *conn,int code,saslprogress *progress)

{
  Curl_easy *data;
  SASLproto *pSVar1;
  proxy_info *ppVar2;
  CURLcode CVar3;
  long port;
  char *pcVar4;
  saslstate sVar5;
  char *service;
  bool bVar6;
  char *resp;
  size_t len;
  char *chlg;
  char *serverdata;
  ntlmdata *local_40;
  size_t chlglen;
  
  data = conn->data;
  resp = (char *)0x0;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    bVar6 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
    ppVar2 = &conn->http_proxy;
    if (bVar6) {
      ppVar2 = (proxy_info *)&conn->host;
    }
    pcVar4 = (ppVar2->host).name;
    if (bVar6) goto LAB_00137346;
    port = conn->port;
  }
  else {
    pcVar4 = (conn->host).name;
LAB_00137346:
    port = (long)conn->remote_port;
  }
  chlg = (char *)0x0;
  chlglen = 0;
  service = (data->set).str[0x32];
  if (service == (char *)0x0) {
    service = sasl->params->service;
  }
  len = 0;
  *progress = SASL_INPROGRESS;
  sVar5 = sasl->state;
  if (sVar5 == SASL_FINAL) {
    CVar3 = CURLE_LOGIN_DENIED;
    if (sasl->params->finalcode == code) {
      CVar3 = CURLE_OK;
    }
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CVar3;
  }
  if (sVar5 == SASL_CANCEL) {
    sasl->authmechs = sasl->authmechs ^ sasl->authused;
    CVar3 = Curl_sasl_start(sasl,conn,sasl->force_ir,progress);
    sVar5 = sasl->state;
    goto LAB_0013769e;
  }
  if (sVar5 == SASL_OAUTH2_RESP) {
    if (sasl->params->finalcode == code) {
      *progress = SASL_DONE;
      sasl->state = SASL_STOP;
      return CURLE_OK;
    }
    if (sasl->params->contcode != code) goto LAB_00137442;
    pcVar4 = "AQ==";
LAB_0013742a:
    resp = (*Curl_cstrdup)(pcVar4);
    if (resp != (char *)0x0) {
      sVar5 = SASL_FINAL;
      goto LAB_001376d5;
    }
    CVar3 = CURLE_OUT_OF_MEMORY;
    goto LAB_001376bf;
  }
  pSVar1 = sasl->params;
  if (pSVar1->contcode != code) {
LAB_00137442:
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CURLE_LOGIN_DENIED;
  }
  switch(sVar5) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return CURLE_OK;
  case SASL_PLAIN:
    CVar3 = Curl_auth_create_plain_message(data,conn->user,conn->passwd,&resp,&len);
    goto LAB_0013769a;
  case SASL_LOGIN:
    CVar3 = Curl_auth_create_login_message(data,conn->user,&resp,&len);
    sVar5 = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    CVar3 = Curl_auth_create_login_message(data,conn->passwd,&resp,&len);
    goto LAB_0013769a;
  case SASL_EXTERNAL:
    CVar3 = Curl_auth_create_external_message(data,conn->user,&resp,&len);
    goto LAB_0013769a;
  case SASL_CRAMMD5:
    (*pSVar1->getmessage)((data->state).buffer,&serverdata);
    CVar3 = Curl_auth_decode_cram_md5_message(serverdata,&chlg,&chlglen);
    if (CVar3 == CURLE_OK) {
      CVar3 = Curl_auth_create_cram_md5_message(data,chlg,conn->user,conn->passwd,&resp,&len);
    }
    (*Curl_cfree)(chlg);
LAB_0013769a:
    sVar5 = SASL_FINAL;
    break;
  case SASL_DIGESTMD5:
    (*pSVar1->getmessage)((data->state).buffer,&serverdata);
    CVar3 = Curl_auth_create_digest_md5_message
                      (data,serverdata,conn->user,conn->passwd,service,&resp,&len);
    sVar5 = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    pcVar4 = "";
    goto LAB_0013742a;
  case SASL_NTLM:
    CVar3 = Curl_auth_create_ntlm_type1_message(data,conn->user,conn->passwd,&conn->ntlm,&resp,&len)
    ;
    sVar5 = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    (*pSVar1->getmessage)((data->state).buffer,&serverdata);
    local_40 = &conn->ntlm;
    CVar3 = Curl_auth_decode_ntlm_type2_message(data,serverdata,local_40);
    sVar5 = SASL_FINAL;
    if (CVar3 == CURLE_OK) {
      CVar3 = Curl_auth_create_ntlm_type3_message(data,conn->user,conn->passwd,local_40,&resp,&len);
    }
    break;
  default:
    Curl_failf(data,"Unsupported SASL authentication mechanism");
    CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_001376bf;
  case SASL_OAUTH2:
    if (sasl->authused != 0x100) {
      CVar3 = Curl_auth_create_oauth_bearer_message
                        (data,conn->user,(char *)0x0,0,conn->oauth_bearer,&resp,&len);
      goto LAB_0013769a;
    }
    CVar3 = Curl_auth_create_oauth_bearer_message
                      (data,conn->user,pcVar4,port,conn->oauth_bearer,&resp,&len);
    sVar5 = SASL_OAUTH2_RESP;
  }
LAB_0013769e:
  if (CVar3 == CURLE_OK) {
    if (resp == (char *)0x0) {
      CVar3 = CURLE_OK;
    }
    else {
LAB_001376d5:
      CVar3 = (*sasl->params->sendcont)(conn,resp);
    }
  }
  else if (CVar3 == CURLE_BAD_CONTENT_ENCODING) {
    CVar3 = (*sasl->params->sendcont)(conn,"*");
    sVar5 = SASL_CANCEL;
  }
  else {
LAB_001376bf:
    *progress = SASL_DONE;
    sVar5 = SASL_STOP;
  }
  (*Curl_cfree)(resp);
  sasl->state = sVar5;
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct connectdata *conn,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  saslstate newstate = SASL_FINAL;
  char *resp = NULL;
  const char * const hostname = SSL_IS_PROXY() ? conn->http_proxy.host.name :
    conn->host.name;
  const long int port = SSL_IS_PROXY() ? conn->port : conn->remote_port;
#if !defined(CURL_DISABLE_CRYPTO_AUTH)
  char *chlg = NULL;
  size_t chlglen = 0;
#endif
#if !defined(CURL_DISABLE_CRYPTO_AUTH) || defined(USE_KERBEROS5)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
                        data->set.str[STRING_SERVICE_NAME] :
                        sasl->params->service;
#endif
#if !defined(CURL_DISABLE_CRYPTO_AUTH) || defined(USE_KERBEROS5) || \
    defined(USE_NTLM)
  char *serverdata;
#endif
  size_t len = 0;

  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && sasl->state != SASL_OAUTH2_RESP &&
     code != sasl->params->contcode) {
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = Curl_auth_create_plain_message(data, conn->user, conn->passwd,
                                            &resp,
                                            &len);
    break;
  case SASL_LOGIN:
    result = Curl_auth_create_login_message(data, conn->user, &resp, &len);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    result = Curl_auth_create_login_message(data, conn->passwd, &resp, &len);
    break;
  case SASL_EXTERNAL:
    result = Curl_auth_create_external_message(data, conn->user, &resp, &len);
    break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
  case SASL_CRAMMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_decode_cram_md5_message(serverdata, &chlg, &chlglen);
    if(!result)
      result = Curl_auth_create_cram_md5_message(data, chlg, conn->user,
                                                 conn->passwd, &resp, &len);
    free(chlg);
    break;
  case SASL_DIGESTMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_create_digest_md5_message(data, serverdata,
                                                 conn->user, conn->passwd,
                                                 service,
                                                 &resp, &len);
    newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    resp = strdup("");
    if(!resp)
      result = CURLE_OUT_OF_MEMORY;
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data,
                                                 conn->user, conn->passwd,
                                                 &conn->ntlm, &resp, &len);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_decode_ntlm_type2_message(data, serverdata,
                                                 &conn->ntlm);
    if(!result)
      result = Curl_auth_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp, &len);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  service,
                                                  data->easy_conn->host.name,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp, &len);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    if(sasl->mutual_auth) {
      /* Decode the user token challenge and create the optional response
         message */
      result = Curl_auth_create_gssapi_user_message(data, NULL, NULL,
                                                    NULL, NULL,
                                                    sasl->mutual_auth,
                                                    serverdata, &conn->krb5,
                                                    &resp, &len);
      newstate = SASL_GSSAPI_NO_DATA;
    }
    else
      /* Decode the security challenge and create the response message */
      result = Curl_auth_create_gssapi_security_message(data, serverdata,
                                                        &conn->krb5,
                                                        &resp, &len);
    break;
  case SASL_GSSAPI_NO_DATA:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    /* Decode the security challenge and create the response message */
    result = Curl_auth_create_gssapi_security_message(data, serverdata,
                                                      &conn->krb5,
                                                      &resp, &len);
    break;
#endif

  case SASL_OAUTH2:
    /* Create the authorisation message */
    if(sasl->authused == SASL_MECH_OAUTHBEARER) {
      result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                     hostname,
                                                     port,
                                                     conn->oauth_bearer,
                                                     &resp, &len);

      /* Failures maybe sent by the server as continuations for OAUTHBEARER */
      newstate = SASL_OAUTH2_RESP;
    }
    else
      result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                     NULL, 0,
                                                     conn->oauth_bearer,
                                                     &resp, &len);
    break;

  case SASL_OAUTH2_RESP:
    /* The continuation is optional so check the response code */
    if(code == sasl->params->finalcode) {
      /* Final response was received so we are done */
      *progress = SASL_DONE;
      state(sasl, conn, SASL_STOP);
      return result;
    }
    else if(code == sasl->params->contcode) {
      /* Acknowledge the continuation by sending a 0x01 response base64
         encoded */
      resp = strdup("AQ==");
      if(!resp)
        result = CURLE_OUT_OF_MEMORY;
      break;
    }
    else {
      *progress = SASL_DONE;
      state(sasl, conn, SASL_STOP);
      return CURLE_LOGIN_DENIED;
    }

  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    result = Curl_sasl_start(sasl, conn, sasl->force_ir, progress);
    newstate = sasl->state;   /* Use state from Curl_sasl_start() */
    break;
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->sendcont(conn, "*");
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    if(resp)
      result = sasl->params->sendcont(conn, resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  free(resp);

  state(sasl, conn, newstate);

  return result;
}